

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfl_ssse3.c
# Opt level: O2

void cfl_predict_hbd_ssse3
               (int16_t *pred_buf_q3,uint16_t *dst,int dst_stride,int alpha_q3,int bd,int width,
               int height)

{
  uint16_t uVar1;
  short sVar5;
  undefined1 (*pauVar6) [16];
  undefined1 auVar7 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  short sVar11;
  ushort uVar12;
  short sVar14;
  ushort uVar15;
  short sVar16;
  short sVar17;
  ushort uVar18;
  short sVar19;
  short sVar20;
  ushort uVar21;
  short sVar22;
  short sVar23;
  ushort uVar24;
  short sVar25;
  short sVar26;
  ushort uVar27;
  short sVar28;
  short sVar29;
  ushort uVar30;
  short sVar31;
  short sVar32;
  undefined1 auVar13 [16];
  short sVar33;
  ushort uVar34;
  short sVar35;
  short sVar36;
  undefined1 auVar37 [16];
  uint16_t uVar2;
  uint16_t uVar3;
  uint16_t uVar4;
  
  auVar7 = pshuflw(ZEXT416((uint)alpha_q3),ZEXT416((uint)alpha_q3),0);
  auVar7._4_4_ = auVar7._0_4_;
  auVar7._8_4_ = auVar7._0_4_;
  auVar7._12_4_ = auVar7._0_4_;
  auVar8 = pabsw(in_XMM1,auVar7);
  auVar8 = psllw(auVar8,9);
  auVar9 = pshuflw(ZEXT216(*dst),ZEXT216(*dst),0);
  auVar10._8_4_ = 0xffffffff;
  auVar10._0_8_ = 0xffffffffffffffff;
  auVar10._12_4_ = 0xffffffff;
  auVar10 = psllw(auVar10,ZEXT416((uint)bd));
  auVar13._8_4_ = 0xffffffff;
  auVar13._0_8_ = 0xffffffffffffffff;
  auVar13._12_4_ = 0xffffffff;
  pauVar6 = (undefined1 (*) [16])(pred_buf_q3 + (ulong)(uint)(height << 2) * 8);
  auVar10 = auVar10 ^ auVar13;
  do {
    auVar13 = *(undefined1 (*) [16])pred_buf_q3;
    auVar37 = psignw(auVar7,auVar13);
    auVar13 = pabsw(auVar13,auVar13);
    auVar13 = pmulhrsw(auVar13,auVar8);
    auVar13 = psignw(auVar13,auVar37);
    sVar32 = auVar9._0_2_;
    sVar11 = auVar13._0_2_ + sVar32;
    sVar36 = auVar9._2_2_;
    sVar14 = auVar13._2_2_ + sVar36;
    sVar17 = auVar13._4_2_ + sVar32;
    sVar20 = auVar13._6_2_ + sVar36;
    sVar23 = auVar13._8_2_ + sVar32;
    sVar26 = auVar13._10_2_ + sVar36;
    sVar29 = auVar13._12_2_ + sVar32;
    sVar33 = auVar13._14_2_ + sVar36;
    sVar5 = auVar10._0_2_;
    uVar12 = (ushort)(sVar5 < sVar11) * sVar5 | (ushort)(sVar5 >= sVar11) * sVar11;
    sVar11 = auVar10._2_2_;
    uVar15 = (ushort)(sVar11 < sVar14) * sVar11 | (ushort)(sVar11 >= sVar14) * sVar14;
    sVar14 = auVar10._4_2_;
    uVar18 = (ushort)(sVar14 < sVar17) * sVar14 | (ushort)(sVar14 >= sVar17) * sVar17;
    sVar17 = auVar10._6_2_;
    uVar21 = (ushort)(sVar17 < sVar20) * sVar17 | (ushort)(sVar17 >= sVar20) * sVar20;
    sVar20 = auVar10._8_2_;
    uVar24 = (ushort)(sVar20 < sVar23) * sVar20 | (ushort)(sVar20 >= sVar23) * sVar23;
    sVar23 = auVar10._10_2_;
    uVar27 = (ushort)(sVar23 < sVar26) * sVar23 | (ushort)(sVar23 >= sVar26) * sVar26;
    sVar26 = auVar10._12_2_;
    uVar30 = (ushort)(sVar26 < sVar29) * sVar26 | (ushort)(sVar26 >= sVar29) * sVar29;
    sVar29 = auVar10._14_2_;
    uVar34 = (ushort)(sVar29 < sVar33) * sVar29 | (ushort)(sVar29 >= sVar33) * sVar33;
    uVar1 = (-1 < (short)uVar12) * uVar12;
    uVar2 = (-1 < (short)uVar15) * uVar15;
    uVar3 = (-1 < (short)uVar18) * uVar18;
    uVar4 = (-1 < (short)uVar21) * uVar21;
    if (width == 4) {
      *dst = uVar1;
      dst[1] = uVar2;
      dst[2] = uVar3;
      dst[3] = uVar4;
    }
    else {
      *dst = uVar1;
      dst[1] = uVar2;
      dst[2] = uVar3;
      dst[3] = uVar4;
      dst[4] = (-1 < (short)uVar24) * uVar24;
      dst[5] = (-1 < (short)uVar27) * uVar27;
      dst[6] = (-1 < (short)uVar30) * uVar30;
      dst[7] = (-1 < (short)uVar34) * uVar34;
      if (0xf < width) {
        auVar13 = *(undefined1 (*) [16])((long)pred_buf_q3 + 0x10);
        auVar37 = psignw(auVar7,auVar13);
        auVar13 = pabsw(auVar13,auVar13);
        auVar13 = pmulhrsw(auVar13,auVar8);
        auVar13 = psignw(auVar13,auVar37);
        sVar33 = auVar13._0_2_ + sVar32;
        sVar16 = auVar13._2_2_ + sVar36;
        sVar19 = auVar13._4_2_ + sVar32;
        sVar22 = auVar13._6_2_ + sVar36;
        sVar25 = auVar13._8_2_ + sVar32;
        sVar28 = auVar13._10_2_ + sVar36;
        sVar31 = auVar13._12_2_ + sVar32;
        sVar35 = auVar13._14_2_ + sVar36;
        uVar12 = (ushort)(sVar5 < sVar33) * sVar5 | (ushort)(sVar5 >= sVar33) * sVar33;
        uVar15 = (ushort)(sVar11 < sVar16) * sVar11 | (ushort)(sVar11 >= sVar16) * sVar16;
        uVar18 = (ushort)(sVar14 < sVar19) * sVar14 | (ushort)(sVar14 >= sVar19) * sVar19;
        uVar21 = (ushort)(sVar17 < sVar22) * sVar17 | (ushort)(sVar17 >= sVar22) * sVar22;
        uVar24 = (ushort)(sVar20 < sVar25) * sVar20 | (ushort)(sVar20 >= sVar25) * sVar25;
        uVar27 = (ushort)(sVar23 < sVar28) * sVar23 | (ushort)(sVar23 >= sVar28) * sVar28;
        uVar30 = (ushort)(sVar26 < sVar31) * sVar26 | (ushort)(sVar26 >= sVar31) * sVar31;
        uVar34 = (ushort)(sVar29 < sVar35) * sVar29 | (ushort)(sVar29 >= sVar35) * sVar35;
        dst[8] = (-1 < (short)uVar12) * uVar12;
        dst[9] = (-1 < (short)uVar15) * uVar15;
        dst[10] = (-1 < (short)uVar18) * uVar18;
        dst[0xb] = (-1 < (short)uVar21) * uVar21;
        dst[0xc] = (-1 < (short)uVar24) * uVar24;
        dst[0xd] = (-1 < (short)uVar27) * uVar27;
        dst[0xe] = (-1 < (short)uVar30) * uVar30;
        dst[0xf] = (-1 < (short)uVar34) * uVar34;
        if (width == 0x20) {
          auVar13 = *(undefined1 (*) [16])((long)pred_buf_q3 + 0x20);
          auVar37 = psignw(auVar7,auVar13);
          auVar13 = pabsw(auVar13,auVar13);
          auVar13 = pmulhrsw(auVar13,auVar8);
          auVar13 = psignw(auVar13,auVar37);
          sVar33 = auVar13._0_2_ + sVar32;
          sVar16 = auVar13._2_2_ + sVar36;
          sVar19 = auVar13._4_2_ + sVar32;
          sVar22 = auVar13._6_2_ + sVar36;
          sVar25 = auVar13._8_2_ + sVar32;
          sVar28 = auVar13._10_2_ + sVar36;
          sVar31 = auVar13._12_2_ + sVar32;
          sVar35 = auVar13._14_2_ + sVar36;
          uVar12 = (ushort)(sVar5 < sVar33) * sVar5 | (ushort)(sVar5 >= sVar33) * sVar33;
          uVar15 = (ushort)(sVar11 < sVar16) * sVar11 | (ushort)(sVar11 >= sVar16) * sVar16;
          uVar18 = (ushort)(sVar14 < sVar19) * sVar14 | (ushort)(sVar14 >= sVar19) * sVar19;
          uVar21 = (ushort)(sVar17 < sVar22) * sVar17 | (ushort)(sVar17 >= sVar22) * sVar22;
          uVar24 = (ushort)(sVar20 < sVar25) * sVar20 | (ushort)(sVar20 >= sVar25) * sVar25;
          uVar27 = (ushort)(sVar23 < sVar28) * sVar23 | (ushort)(sVar23 >= sVar28) * sVar28;
          uVar30 = (ushort)(sVar26 < sVar31) * sVar26 | (ushort)(sVar26 >= sVar31) * sVar31;
          uVar34 = (ushort)(sVar29 < sVar35) * sVar29 | (ushort)(sVar29 >= sVar35) * sVar35;
          dst[0x10] = (-1 < (short)uVar12) * uVar12;
          dst[0x11] = (-1 < (short)uVar15) * uVar15;
          dst[0x12] = (-1 < (short)uVar18) * uVar18;
          dst[0x13] = (-1 < (short)uVar21) * uVar21;
          dst[0x14] = (-1 < (short)uVar24) * uVar24;
          dst[0x15] = (-1 < (short)uVar27) * uVar27;
          dst[0x16] = (-1 < (short)uVar30) * uVar30;
          dst[0x17] = (-1 < (short)uVar34) * uVar34;
          auVar13 = *(undefined1 (*) [16])((long)pred_buf_q3 + 0x30);
          auVar37 = psignw(auVar7,auVar13);
          auVar13 = pabsw(auVar13,auVar13);
          auVar13 = pmulhrsw(auVar13,auVar8);
          auVar13 = psignw(auVar13,auVar37);
          sVar33 = auVar13._0_2_ + sVar32;
          sVar16 = auVar13._2_2_ + sVar36;
          sVar19 = auVar13._4_2_ + sVar32;
          sVar22 = auVar13._6_2_ + sVar36;
          sVar25 = auVar13._8_2_ + sVar32;
          sVar28 = auVar13._10_2_ + sVar36;
          sVar32 = auVar13._12_2_ + sVar32;
          sVar36 = auVar13._14_2_ + sVar36;
          uVar12 = (ushort)(sVar5 < sVar33) * sVar5 | (ushort)(sVar5 >= sVar33) * sVar33;
          uVar15 = (ushort)(sVar11 < sVar16) * sVar11 | (ushort)(sVar11 >= sVar16) * sVar16;
          uVar18 = (ushort)(sVar14 < sVar19) * sVar14 | (ushort)(sVar14 >= sVar19) * sVar19;
          uVar21 = (ushort)(sVar17 < sVar22) * sVar17 | (ushort)(sVar17 >= sVar22) * sVar22;
          uVar24 = (ushort)(sVar20 < sVar25) * sVar20 | (ushort)(sVar20 >= sVar25) * sVar25;
          uVar27 = (ushort)(sVar23 < sVar28) * sVar23 | (ushort)(sVar23 >= sVar28) * sVar28;
          uVar30 = (ushort)(sVar26 < sVar32) * sVar26 | (ushort)(sVar26 >= sVar32) * sVar32;
          uVar34 = (ushort)(sVar29 < sVar36) * sVar29 | (ushort)(sVar29 >= sVar36) * sVar36;
          dst[0x18] = (-1 < (short)uVar12) * uVar12;
          dst[0x19] = (-1 < (short)uVar15) * uVar15;
          dst[0x1a] = (-1 < (short)uVar18) * uVar18;
          dst[0x1b] = (-1 < (short)uVar21) * uVar21;
          dst[0x1c] = (-1 < (short)uVar24) * uVar24;
          dst[0x1d] = (-1 < (short)uVar27) * uVar27;
          dst[0x1e] = (-1 < (short)uVar30) * uVar30;
          dst[0x1f] = (-1 < (short)uVar34) * uVar34;
        }
      }
    }
    pred_buf_q3 = (int16_t *)((long)pred_buf_q3 + 0x40);
    dst = dst + dst_stride;
  } while (pred_buf_q3 < pauVar6);
  return;
}

Assistant:

static inline void cfl_predict_hbd_ssse3(const int16_t *pred_buf_q3,
                                         uint16_t *dst, int dst_stride,
                                         int alpha_q3, int bd, int width,
                                         int height) {
  const __m128i alpha_sign = _mm_set1_epi16(alpha_q3);
  const __m128i alpha_q12 = _mm_slli_epi16(_mm_abs_epi16(alpha_sign), 9);
  const __m128i dc_q0 = _mm_set1_epi16(*dst);
  const __m128i max = highbd_max_epi16(bd);
  const __m128i zeros = _mm_setzero_si128();
  __m128i *row = (__m128i *)pred_buf_q3;
  const __m128i *row_end = row + height * CFL_BUF_LINE_I128;
  do {
    __m128i res = predict_unclipped(row, alpha_q12, alpha_sign, dc_q0);
    res = highbd_clamp_epi16(res, zeros, max);
    if (width == 4) {
      _mm_storel_epi64((__m128i *)dst, res);
    } else {
      _mm_storeu_si128((__m128i *)dst, res);
    }
    if (width >= 16) {
      const __m128i res_1 =
          predict_unclipped(row + 1, alpha_q12, alpha_sign, dc_q0);
      _mm_storeu_si128(((__m128i *)dst) + 1,
                       highbd_clamp_epi16(res_1, zeros, max));
    }
    if (width == 32) {
      const __m128i res_2 =
          predict_unclipped(row + 2, alpha_q12, alpha_sign, dc_q0);
      _mm_storeu_si128((__m128i *)(dst + 16),
                       highbd_clamp_epi16(res_2, zeros, max));
      const __m128i res_3 =
          predict_unclipped(row + 3, alpha_q12, alpha_sign, dc_q0);
      _mm_storeu_si128((__m128i *)(dst + 24),
                       highbd_clamp_epi16(res_3, zeros, max));
    }
    dst += dst_stride;
  } while ((row += CFL_BUF_LINE_I128) < row_end);
}